

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_257,_false,_embree::avx512::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  char cVar29;
  byte bVar30;
  bool bVar31;
  ulong uVar32;
  ulong *puVar33;
  long lVar34;
  NodeRef root;
  uint uVar35;
  undefined1 (*pauVar36) [32];
  undefined4 uVar37;
  byte bVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar43 [16];
  int iVar42;
  int iVar58;
  int iVar59;
  int iVar61;
  int iVar62;
  int iVar63;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar44 [16];
  undefined1 auVar47 [32];
  int iVar60;
  int iVar64;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar65 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 in_ZMM4 [64];
  float fVar71;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar72 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  vfloat4 a0;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  byte local_5c44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5be0;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  undefined4 uStack_5b24;
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  uint local_5a40;
  uint uStack_5a3c;
  uint uStack_5a38;
  uint uStack_5a34;
  uint uStack_5a30;
  uint uStack_5a2c;
  uint uStack_5a28;
  uint uStack_5a24;
  uint local_5a20;
  uint uStack_5a1c;
  uint uStack_5a18;
  uint uStack_5a14;
  uint uStack_5a10;
  uint uStack_5a0c;
  uint uStack_5a08;
  uint uStack_5a04;
  uint local_5a00;
  uint uStack_59fc;
  uint uStack_59f8;
  uint uStack_59f4;
  uint uStack_59f0;
  uint uStack_59ec;
  uint uStack_59e8;
  uint uStack_59e4;
  undefined1 local_59e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  uint local_4660;
  uint uStack_465c;
  uint uStack_4658;
  uint uStack_4654;
  uint uStack_4650;
  uint uStack_464c;
  uint uStack_4648;
  uint uStack_4644;
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  sVar2 = (bvh->root).ptr;
  if (sVar2 != 8) {
    auVar49 = *(undefined1 (*) [32])(ray + 0x100);
    auVar46 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar39 = vcmpps_avx512vl(auVar49,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar32 = vpcmpeqd_avx512vl(auVar46,(undefined1  [32])valid_i->field_0);
    uVar39 = uVar39 & uVar32;
    bVar38 = (byte)uVar39;
    if (bVar38 != 0) {
      local_5b80 = *(undefined1 (*) [32])(ray + 0x80);
      local_5b60 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5b40 = *(undefined1 (*) [32])(ray + 0xc0);
      fVar11 = local_5b40._0_4_;
      auVar91._0_4_ = fVar11 * fVar11;
      fVar12 = local_5b40._4_4_;
      auVar91._4_4_ = fVar12 * fVar12;
      fVar13 = local_5b40._8_4_;
      auVar91._8_4_ = fVar13 * fVar13;
      fVar14 = local_5b40._12_4_;
      auVar91._12_4_ = fVar14 * fVar14;
      fVar15 = local_5b40._16_4_;
      auVar91._16_4_ = fVar15 * fVar15;
      fVar16 = local_5b40._20_4_;
      auVar91._20_4_ = fVar16 * fVar16;
      fVar17 = local_5b40._24_4_;
      auVar91._28_36_ = in_ZMM4._28_36_;
      auVar91._24_4_ = fVar17 * fVar17;
      auVar81 = vfmadd231ps_fma(auVar91._0_32_,local_5b60,local_5b60);
      auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_5b80,local_5b80);
      auVar45 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      auVar46._8_4_ = 0xbf000000;
      auVar46._0_8_ = 0xbf000000bf000000;
      auVar46._12_4_ = 0xbf000000;
      auVar46._16_4_ = 0xbf000000;
      auVar46._20_4_ = 0xbf000000;
      auVar46._24_4_ = 0xbf000000;
      auVar46._28_4_ = 0xbf000000;
      auVar46 = vmulps_avx512vl(ZEXT1632(auVar81),auVar46);
      fVar71 = auVar45._0_4_;
      fVar75 = auVar45._4_4_;
      fVar76 = auVar45._8_4_;
      fVar77 = auVar45._12_4_;
      fVar78 = auVar45._16_4_;
      fVar79 = auVar45._20_4_;
      fVar80 = auVar45._24_4_;
      auVar81._0_4_ = fVar71 * fVar71;
      auVar81._4_4_ = fVar75 * fVar75;
      auVar81._8_4_ = fVar76 * fVar76;
      auVar81._12_4_ = fVar77 * fVar77;
      auVar48._4_4_ = auVar81._4_4_ * fVar75 * auVar46._4_4_;
      auVar48._0_4_ = auVar81._0_4_ * fVar71 * auVar46._0_4_;
      auVar48._8_4_ = auVar81._8_4_ * fVar76 * auVar46._8_4_;
      auVar48._12_4_ = auVar81._12_4_ * fVar77 * auVar46._12_4_;
      auVar48._16_4_ = fVar78 * fVar78 * fVar78 * auVar46._16_4_;
      auVar48._20_4_ = fVar79 * fVar79 * fVar79 * auVar46._20_4_;
      auVar48._24_4_ = fVar80 * fVar80 * fVar80 * auVar46._24_4_;
      auVar48._28_4_ = auVar46._28_4_;
      auVar47._8_4_ = 0x3fc00000;
      auVar47._0_8_ = 0x3fc000003fc00000;
      auVar47._12_4_ = 0x3fc00000;
      auVar47._16_4_ = 0x3fc00000;
      auVar47._20_4_ = 0x3fc00000;
      auVar47._24_4_ = 0x3fc00000;
      auVar47._28_4_ = 0x3fc00000;
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar48,auVar45,auVar47);
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar72._12_4_ = 0;
      auVar72._0_12_ = ZEXT812(0);
      auVar72 = auVar72 << 0x20;
      auVar81 = vpcmpeqd_avx(auVar81,auVar81);
      uVar32 = uVar39;
      do {
        lVar34 = 0;
        for (uVar41 = uVar32; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar41 = (ulong)(uint)((int)lVar34 * 4);
        auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar41 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar41 + 0xa0)),0x1c);
        fVar71 = *(float *)((long)&local_59c0 + uVar41);
        auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + uVar41 + 0xc0)),0x28);
        auVar88._0_4_ = auVar43._0_4_ * fVar71;
        auVar88._4_4_ = auVar43._4_4_ * fVar71;
        auVar88._8_4_ = auVar43._8_4_ * fVar71;
        auVar88._12_4_ = auVar43._12_4_ * fVar71;
        auVar43 = vshufpd_avx(auVar88,auVar88,1);
        auVar89 = vmovshdup_avx(auVar88);
        auVar94 = vunpckhps_avx(auVar88,auVar72);
        auVar44._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
        auVar44._8_8_ = auVar43._8_8_ ^ auVar69._8_8_;
        auVar44 = vinsertps_avx(auVar44,auVar88,0x2a);
        auVar43 = vdpps_avx(auVar44,auVar44,0x7f);
        auVar94 = vshufps_avx(auVar94,ZEXT416(auVar89._0_4_ ^ 0x80000000),0x41);
        auVar89 = vdpps_avx(auVar94,auVar94,0x7f);
        uVar18 = vcmpps_avx512vl(auVar43,auVar89,1);
        auVar43 = vpmovm2d_avx512vl(uVar18);
        auVar97._0_4_ = auVar43._0_4_;
        auVar97._4_4_ = auVar97._0_4_;
        auVar97._8_4_ = auVar97._0_4_;
        auVar97._12_4_ = auVar97._0_4_;
        uVar41 = vpmovd2m_avx512vl(auVar97);
        auVar43._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar81._4_4_;
        auVar43._0_4_ = (uint)((byte)uVar41 & 1) * auVar81._0_4_;
        auVar43._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar81._8_4_;
        auVar43._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar81._12_4_;
        auVar43 = vblendvps_avx(auVar44,auVar94,auVar43);
        auVar89 = vdpps_avx(auVar43,auVar43,0x7f);
        auVar44 = vrsqrt14ss_avx512f(auVar72,ZEXT416((uint)auVar89._0_4_));
        fVar75 = auVar44._0_4_;
        fVar75 = fVar75 * 1.5 - auVar89._0_4_ * 0.5 * fVar75 * fVar75 * fVar75;
        auVar94._0_4_ = auVar43._0_4_ * fVar75;
        auVar94._4_4_ = auVar43._4_4_ * fVar75;
        auVar94._8_4_ = auVar43._8_4_ * fVar75;
        auVar94._12_4_ = auVar43._12_4_ * fVar75;
        auVar43 = vshufps_avx(auVar94,auVar94,0xc9);
        auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar98._0_4_ = auVar94._0_4_ * auVar89._0_4_;
        auVar98._4_4_ = auVar94._4_4_ * auVar89._4_4_;
        auVar98._8_4_ = auVar94._8_4_ * auVar89._8_4_;
        auVar98._12_4_ = auVar94._12_4_ * auVar89._12_4_;
        auVar43 = vfmsub231ps_fma(auVar98,auVar88,auVar43);
        lVar34 = lVar34 * 0x30;
        auVar89 = vshufps_avx(auVar43,auVar43,0xc9);
        auVar43 = vdpps_avx(auVar89,auVar89,0x7f);
        uVar32 = uVar32 - 1 & uVar32;
        auVar44 = vrsqrt14ss_avx512f(auVar72,ZEXT416((uint)auVar43._0_4_));
        fVar75 = auVar44._0_4_;
        fVar75 = fVar75 * 1.5 - auVar43._0_4_ * 0.5 * fVar75 * fVar75 * fVar75;
        auVar95._0_4_ = fVar75 * auVar89._0_4_;
        auVar95._4_4_ = fVar75 * auVar89._4_4_;
        auVar95._8_4_ = fVar75 * auVar89._8_4_;
        auVar95._12_4_ = fVar75 * auVar89._12_4_;
        auVar89._0_4_ = fVar71 * auVar88._0_4_;
        auVar89._4_4_ = fVar71 * auVar88._4_4_;
        auVar89._8_4_ = fVar71 * auVar88._8_4_;
        auVar89._12_4_ = fVar71 * auVar88._12_4_;
        auVar44 = vunpcklps_avx(auVar94,auVar89);
        auVar43 = vunpckhps_avx(auVar94,auVar89);
        auVar94 = vunpcklps_avx(auVar95,auVar72);
        auVar89 = vunpckhps_avx(auVar95,auVar72);
        auVar89 = vunpcklps_avx(auVar43,auVar89);
        auVar91 = ZEXT1664(auVar89);
        auVar88 = vunpcklps_avx(auVar44,auVar94);
        auVar43 = vunpckhps_avx(auVar44,auVar94);
        auVar92 = ZEXT1664(auVar43);
        *(undefined1 (*) [16])(local_59a0 + lVar34) = auVar88;
        *(undefined1 (*) [16])(auStack_5990 + lVar34) = auVar43;
        *(undefined1 (*) [16])(auStack_5980 + lVar34) = auVar89;
      } while (uVar32 != 0);
      local_5be0._0_4_ = *(undefined4 *)ray;
      local_5be0._4_4_ = *(undefined4 *)(ray + 4);
      local_5be0._8_4_ = *(undefined4 *)(ray + 8);
      local_5be0._12_4_ = *(undefined4 *)(ray + 0xc);
      local_5be0._16_4_ = *(undefined4 *)(ray + 0x10);
      local_5be0._20_4_ = *(undefined4 *)(ray + 0x14);
      local_5be0._24_4_ = *(undefined4 *)(ray + 0x18);
      local_5be0._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5be0._32_4_ = *(undefined4 *)(ray + 0x20);
      local_5be0._36_4_ = *(undefined4 *)(ray + 0x24);
      local_5be0._40_4_ = *(undefined4 *)(ray + 0x28);
      local_5be0._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_5be0._48_4_ = *(undefined4 *)(ray + 0x30);
      local_5be0._52_4_ = *(undefined4 *)(ray + 0x34);
      local_5be0._56_4_ = *(undefined4 *)(ray + 0x38);
      local_5be0._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5be0._64_4_ = *(undefined4 *)(ray + 0x40);
      local_5be0._68_4_ = *(undefined4 *)(ray + 0x44);
      local_5be0._72_4_ = *(undefined4 *)(ray + 0x48);
      local_5be0._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_5be0._80_4_ = *(undefined4 *)(ray + 0x50);
      local_5be0._84_4_ = *(undefined4 *)(ray + 0x54);
      local_5be0._88_4_ = *(undefined4 *)(ray + 0x58);
      local_5be0._92_4_ = *(undefined4 *)(ray + 0x5c);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar100 = ZEXT3264(auVar46);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar101 = ZEXT3264(auVar47);
      vandps_avx512vl(local_5b80,auVar46);
      uVar32 = vcmpps_avx512vl(auVar47,auVar47,1);
      bVar31 = (bool)((byte)uVar32 & 1);
      iVar42 = auVar47._0_4_;
      auVar45._0_4_ = (uint)bVar31 * iVar42 | (uint)!bVar31 * local_5b80._0_4_;
      bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
      iVar58 = auVar47._4_4_;
      auVar45._4_4_ = (uint)bVar31 * iVar58 | (uint)!bVar31 * local_5b80._4_4_;
      bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
      iVar59 = auVar47._8_4_;
      auVar45._8_4_ = (uint)bVar31 * iVar59 | (uint)!bVar31 * local_5b80._8_4_;
      bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
      iVar60 = auVar47._12_4_;
      auVar45._12_4_ = (uint)bVar31 * iVar60 | (uint)!bVar31 * local_5b80._12_4_;
      bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
      iVar61 = auVar47._16_4_;
      auVar45._16_4_ = (uint)bVar31 * iVar61 | (uint)!bVar31 * local_5b80._16_4_;
      bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
      iVar62 = auVar47._20_4_;
      auVar45._20_4_ = (uint)bVar31 * iVar62 | (uint)!bVar31 * local_5b80._20_4_;
      bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
      iVar63 = auVar47._24_4_;
      iVar64 = auVar47._28_4_;
      auVar45._24_4_ = (uint)bVar31 * iVar63 | (uint)!bVar31 * local_5b80._24_4_;
      bVar31 = SUB81(uVar32 >> 7,0);
      auVar45._28_4_ = (uint)bVar31 * iVar64 | (uint)!bVar31 * local_5b80._28_4_;
      vandps_avx512vl(local_5b60,auVar46);
      uVar32 = vcmpps_avx512vl(auVar45,auVar47,1);
      bVar31 = (bool)((byte)uVar32 & 1);
      auVar50._0_4_ = (uint)bVar31 * iVar42 | (uint)!bVar31 * local_5b60._0_4_;
      bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar31 * iVar58 | (uint)!bVar31 * local_5b60._4_4_;
      bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar31 * iVar59 | (uint)!bVar31 * local_5b60._8_4_;
      bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar31 * iVar60 | (uint)!bVar31 * local_5b60._12_4_;
      bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar31 * iVar61 | (uint)!bVar31 * local_5b60._16_4_;
      bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar31 * iVar62 | (uint)!bVar31 * local_5b60._20_4_;
      bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar31 * iVar63 | (uint)!bVar31 * local_5b60._24_4_;
      bVar31 = SUB81(uVar32 >> 7,0);
      auVar50._28_4_ = (uint)bVar31 * iVar64 | (uint)!bVar31 * local_5b60._28_4_;
      vandps_avx512vl(_local_5b40,auVar46);
      uVar32 = vcmpps_avx512vl(auVar50,auVar47,1);
      bVar31 = (bool)((byte)uVar32 & 1);
      auVar54._0_4_ = (uint)bVar31 * iVar42 | (uint)!bVar31 * (int)fVar11;
      bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar31 * iVar58 | (uint)!bVar31 * (int)fVar12;
      bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar31 * iVar59 | (uint)!bVar31 * (int)fVar13;
      bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
      auVar54._12_4_ = (uint)bVar31 * iVar60 | (uint)!bVar31 * (int)fVar14;
      bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
      auVar54._16_4_ = (uint)bVar31 * iVar61 | (uint)!bVar31 * (int)fVar15;
      bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
      auVar54._20_4_ = (uint)bVar31 * iVar62 | (uint)!bVar31 * (int)fVar16;
      bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
      auVar54._24_4_ = (uint)bVar31 * iVar63 | (uint)!bVar31 * (int)fVar17;
      bVar31 = SUB81(uVar32 >> 7,0);
      auVar54._28_4_ = (uint)bVar31 * iVar64 | (uint)!bVar31 * local_5b40._28_4_;
      auVar46 = vrcp14ps_avx512vl(auVar45);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar102 = ZEXT3264(auVar47);
      auVar43 = ZEXT816(0);
      auVar48 = vfnmadd213ps_avx512vl(auVar45,auVar46,auVar47);
      auVar81 = vfmadd132ps_fma(auVar48,auVar46,auVar46);
      auVar46 = vrcp14ps_avx512vl(auVar50);
      auVar48 = vfnmadd213ps_avx512vl(auVar50,auVar46,auVar47);
      auVar72 = vfmadd132ps_fma(auVar48,auVar46,auVar46);
      auVar46 = vrcp14ps_avx512vl(auVar54);
      auVar47 = vfnmadd213ps_avx512vl(auVar54,auVar46,auVar47);
      local_5b20 = ZEXT1632(auVar81);
      local_5b00 = ZEXT1632(auVar72);
      auVar69 = vfmadd132ps_fma(auVar47,auVar46,auVar46);
      local_5ae0 = ZEXT1632(auVar69);
      local_5ac0._4_4_ = (float)local_5be0._4_4_ * auVar81._4_4_;
      local_5ac0._0_4_ = (float)local_5be0._0_4_ * auVar81._0_4_;
      local_5ac0._8_4_ = (float)local_5be0._8_4_ * auVar81._8_4_;
      local_5ac0._12_4_ = (float)local_5be0._12_4_ * auVar81._12_4_;
      local_5ac0._16_4_ = (float)local_5be0._16_4_ * 0.0;
      local_5ac0._20_4_ = (float)local_5be0._20_4_ * 0.0;
      local_5ac0._24_4_ = (float)local_5be0._24_4_ * 0.0;
      local_5ac0._28_4_ = local_5be0._28_4_;
      local_5aa0._4_4_ = (float)local_5be0._36_4_ * auVar72._4_4_;
      local_5aa0._0_4_ = (float)local_5be0._32_4_ * auVar72._0_4_;
      local_5aa0._8_4_ = (float)local_5be0._40_4_ * auVar72._8_4_;
      local_5aa0._12_4_ = (float)local_5be0._44_4_ * auVar72._12_4_;
      local_5aa0._16_4_ = (float)local_5be0._48_4_ * 0.0;
      local_5aa0._20_4_ = (float)local_5be0._52_4_ * 0.0;
      local_5aa0._24_4_ = (float)local_5be0._56_4_ * 0.0;
      local_5aa0._28_4_ = local_5be0._60_4_;
      local_5a80._4_4_ = (float)local_5be0._68_4_ * auVar69._4_4_;
      local_5a80._0_4_ = (float)local_5be0._64_4_ * auVar69._0_4_;
      local_5a80._8_4_ = (float)local_5be0._72_4_ * auVar69._8_4_;
      local_5a80._12_4_ = (float)local_5be0._76_4_ * auVar69._12_4_;
      local_5a80._16_4_ = (float)local_5be0._80_4_ * 0.0;
      local_5a80._20_4_ = (float)local_5be0._84_4_ * 0.0;
      local_5a80._24_4_ = (float)local_5be0._88_4_ * 0.0;
      local_5a80._28_4_ = local_5be0._92_4_;
      uVar32 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar43),1);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_5a60._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * auVar46._4_4_;
      local_5a60._0_4_ = (uint)((byte)uVar32 & 1) * auVar46._0_4_;
      local_5a60._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * auVar46._8_4_;
      local_5a60._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * auVar46._12_4_;
      local_5a60._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * auVar46._16_4_;
      local_5a60._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * auVar46._20_4_;
      local_5a60._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * auVar46._24_4_;
      local_5a60._28_4_ = (uint)(byte)(uVar32 >> 7) * auVar46._28_4_;
      uVar32 = vcmpps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar43),5);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar31 = (bool)((byte)uVar32 & 1);
      local_5a40 = (uint)bVar31 * auVar46._0_4_ | (uint)!bVar31 * 0x60;
      bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
      uStack_5a3c = (uint)bVar31 * auVar46._4_4_ | (uint)!bVar31 * 0x60;
      bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
      uStack_5a38 = (uint)bVar31 * auVar46._8_4_ | (uint)!bVar31 * 0x60;
      bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
      uStack_5a34 = (uint)bVar31 * auVar46._12_4_ | (uint)!bVar31 * 0x60;
      bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
      uStack_5a30 = (uint)bVar31 * auVar46._16_4_ | (uint)!bVar31 * 0x60;
      bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
      uStack_5a2c = (uint)bVar31 * auVar46._20_4_ | (uint)!bVar31 * 0x60;
      bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
      uStack_5a28 = (uint)bVar31 * auVar46._24_4_ | (uint)!bVar31 * 0x60;
      bVar31 = SUB81(uVar32 >> 7,0);
      uStack_5a24 = (uint)bVar31 * auVar46._28_4_ | (uint)!bVar31 * 0x60;
      auVar47 = ZEXT1632(auVar43);
      uVar32 = vcmpps_avx512vl(ZEXT1632(auVar69),auVar47,5);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar31 = (bool)((byte)uVar32 & 1);
      local_5a20 = (uint)bVar31 * auVar46._0_4_ | (uint)!bVar31 * 0xa0;
      bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
      uStack_5a1c = (uint)bVar31 * auVar46._4_4_ | (uint)!bVar31 * 0xa0;
      bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
      uStack_5a18 = (uint)bVar31 * auVar46._8_4_ | (uint)!bVar31 * 0xa0;
      bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
      uStack_5a14 = (uint)bVar31 * auVar46._12_4_ | (uint)!bVar31 * 0xa0;
      bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
      uStack_5a10 = (uint)bVar31 * auVar46._16_4_ | (uint)!bVar31 * 0xa0;
      bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
      uStack_5a0c = (uint)bVar31 * auVar46._20_4_ | (uint)!bVar31 * 0xa0;
      bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
      uStack_5a08 = (uint)bVar31 * auVar46._24_4_ | (uint)!bVar31 * 0xa0;
      bVar31 = SUB81(uVar32 >> 7,0);
      uStack_5a04 = (uint)bVar31 * auVar46._28_4_ | (uint)!bVar31 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar103 = ZEXT3264(local_4680);
      auVar46 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar47);
      local_5a00 = (uint)(bVar38 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar38 & 1) * local_4680._0_4_
      ;
      bVar31 = (bool)((byte)(uVar39 >> 1) & 1);
      uStack_59fc = (uint)bVar31 * auVar46._4_4_ | (uint)!bVar31 * local_4680._4_4_;
      bVar31 = (bool)((byte)(uVar39 >> 2) & 1);
      uStack_59f8 = (uint)bVar31 * auVar46._8_4_ | (uint)!bVar31 * local_4680._8_4_;
      bVar31 = (bool)((byte)(uVar39 >> 3) & 1);
      uStack_59f4 = (uint)bVar31 * auVar46._12_4_ | (uint)!bVar31 * local_4680._12_4_;
      bVar31 = (bool)((byte)(uVar39 >> 4) & 1);
      uStack_59f0 = (uint)bVar31 * auVar46._16_4_ | (uint)!bVar31 * local_4680._16_4_;
      bVar31 = (bool)((byte)(uVar39 >> 5) & 1);
      uStack_59ec = (uint)bVar31 * auVar46._20_4_ | (uint)!bVar31 * local_4680._20_4_;
      bVar31 = (bool)((byte)(uVar39 >> 6) & 1);
      uStack_59e8 = (uint)bVar31 * auVar46._24_4_ | (uint)!bVar31 * local_4680._24_4_;
      bVar31 = SUB81(uVar39 >> 7,0);
      uStack_59e4 = (uint)bVar31 * auVar46._28_4_ | (uint)!bVar31 * local_4680._28_4_;
      auVar49 = vmaxps_avx512vl(auVar49,auVar47);
      local_59e0._0_4_ = (uint)(bVar38 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar38 & 1) * -0x800000;
      bVar31 = (bool)((byte)(uVar39 >> 1) & 1);
      local_59e0._4_4_ = (uint)bVar31 * auVar49._4_4_ | (uint)!bVar31 * -0x800000;
      bVar31 = (bool)((byte)(uVar39 >> 2) & 1);
      local_59e0._8_4_ = (uint)bVar31 * auVar49._8_4_ | (uint)!bVar31 * -0x800000;
      bVar31 = (bool)((byte)(uVar39 >> 3) & 1);
      local_59e0._12_4_ = (uint)bVar31 * auVar49._12_4_ | (uint)!bVar31 * -0x800000;
      bVar31 = (bool)((byte)(uVar39 >> 4) & 1);
      local_59e0._16_4_ = (uint)bVar31 * auVar49._16_4_ | (uint)!bVar31 * -0x800000;
      bVar31 = (bool)((byte)(uVar39 >> 5) & 1);
      local_59e0._20_4_ = (uint)bVar31 * auVar49._20_4_ | (uint)!bVar31 * -0x800000;
      bVar31 = (bool)((byte)(uVar39 >> 6) & 1);
      local_59e0._24_4_ = (uint)bVar31 * auVar49._24_4_ | (uint)!bVar31 * -0x800000;
      bVar31 = SUB81(uVar39 >> 7,0);
      local_59e0._28_4_ = (uint)bVar31 * auVar49._28_4_ | (uint)!bVar31 * -0x800000;
      local_5c44 = ~bVar38;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar35 = 7;
      }
      else {
        uVar35 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      puVar33 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar36 = (undefined1 (*) [32])local_4640;
      local_4660 = local_5a00;
      uStack_465c = uStack_59fc;
      uStack_4658 = uStack_59f8;
      uStack_4654 = uStack_59f4;
      uStack_4650 = uStack_59f0;
      uStack_464c = uStack_59ec;
      uStack_4648 = uStack_59e8;
      uStack_4644 = uStack_59e4;
      local_5808 = sVar2;
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar104 = ZEXT3264(auVar49);
LAB_007c9bb3:
      do {
        do {
          root.ptr = puVar33[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_007ca17a;
          puVar33 = puVar33 + -1;
          auVar49 = pauVar36[-1];
          auVar66 = ZEXT3264(auVar49);
          pauVar36 = pauVar36 + -1;
          uVar39 = vcmpps_avx512vl(auVar49,local_59e0,1);
        } while ((char)uVar39 == '\0');
        uVar37 = (undefined4)uVar39;
        if (uVar35 < (uint)POPCOUNT(uVar37)) {
LAB_007c9bf2:
          do {
            lVar34 = 0x38;
            uVar39 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_007ca17a;
              uVar18 = vcmpps_avx512vl(auVar66._0_32_,local_59e0,9);
              if ((char)uVar18 != '\0') {
                if (local_5c44 == 0xff) {
                  bVar30 = 0;
                }
                else {
                  uVar39 = (ulong)(byte)~local_5c44;
                  bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                  pvVar3 = This->leafIntersector;
                  bVar30 = 0;
                  do {
                    lVar34 = 0;
                    for (uVar32 = uVar39; (uVar32 & 1) == 0;
                        uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                      lVar34 = lVar34 + 1;
                    }
                    auVar91 = ZEXT1664(auVar91._0_16_);
                    auVar92 = ZEXT1664(auVar92._0_16_);
                    cVar29 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x28))
                                       (&local_59c0,ray,lVar34,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    bVar23 = (byte)(1 << ((uint)lVar34 & 0x1f));
                    if (cVar29 == '\0') {
                      bVar23 = 0;
                    }
                    bVar30 = bVar30 | bVar23;
                    uVar39 = uVar39 - 1 & uVar39;
                  } while (uVar39 != 0);
                }
                local_5c44 = local_5c44 | bVar30;
                if (local_5c44 == 0xff) {
                  local_5c44 = 0xff;
                  goto LAB_007ca17a;
                }
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar31 = (bool)(local_5c44 >> 1 & 1);
                bVar4 = (bool)(local_5c44 >> 2 & 1);
                bVar5 = (bool)(local_5c44 >> 3 & 1);
                bVar6 = (bool)(local_5c44 >> 4 & 1);
                bVar7 = (bool)(local_5c44 >> 5 & 1);
                bVar8 = (bool)(local_5c44 >> 6 & 1);
                local_59e0._4_4_ = (uint)bVar31 * auVar49._4_4_ | (uint)!bVar31 * local_59e0._4_4_;
                local_59e0._0_4_ =
                     (uint)(local_5c44 & 1) * auVar49._0_4_ |
                     (uint)!(bool)(local_5c44 & 1) * local_59e0._0_4_;
                local_59e0._8_4_ = (uint)bVar4 * auVar49._8_4_ | (uint)!bVar4 * local_59e0._8_4_;
                local_59e0._12_4_ = (uint)bVar5 * auVar49._12_4_ | (uint)!bVar5 * local_59e0._12_4_;
                local_59e0._16_4_ = (uint)bVar6 * auVar49._16_4_ | (uint)!bVar6 * local_59e0._16_4_;
                local_59e0._20_4_ = (uint)bVar7 * auVar49._20_4_ | (uint)!bVar7 * local_59e0._20_4_;
                local_59e0._24_4_ = (uint)bVar8 * auVar49._24_4_ | (uint)!bVar8 * local_59e0._24_4_;
                local_59e0._28_4_ =
                     (uint)(local_5c44 >> 7) * auVar49._28_4_ |
                     (uint)!(bool)(local_5c44 >> 7) * local_59e0._28_4_;
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar100 = ZEXT3264(auVar49);
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar101 = ZEXT3264(auVar49);
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar102 = ZEXT3264(auVar49);
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar103 = ZEXT3264(auVar49);
                auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar104 = ZEXT3264(auVar49);
              }
              goto LAB_007c9bb3;
            }
            uVar32 = root.ptr & 0xfffffffffffffff0;
            auVar49 = auVar103._0_32_;
            do {
              uVar41 = *(ulong *)((uVar32 - 0x1c0) + lVar34 * 8);
              if (uVar41 == 8) {
                auVar66 = ZEXT3264(auVar49);
                break;
              }
              auVar66._28_36_ = auVar91._28_36_;
              if ((root.ptr & 7) == 0) {
                uVar37 = *(undefined4 *)((root.ptr - 0xa0) + lVar34 * 4);
                auVar73._4_4_ = uVar37;
                auVar73._0_4_ = uVar37;
                auVar73._8_4_ = uVar37;
                auVar73._12_4_ = uVar37;
                auVar73._16_4_ = uVar37;
                auVar73._20_4_ = uVar37;
                auVar73._24_4_ = uVar37;
                auVar73._28_4_ = uVar37;
                auVar81 = vfmsub132ps_fma(auVar73,local_5ac0,local_5b20);
                uVar37 = *(undefined4 *)((root.ptr - 0x60) + lVar34 * 4);
                auVar84._4_4_ = uVar37;
                auVar84._0_4_ = uVar37;
                auVar84._8_4_ = uVar37;
                auVar84._12_4_ = uVar37;
                auVar84._16_4_ = uVar37;
                auVar84._20_4_ = uVar37;
                auVar84._24_4_ = uVar37;
                auVar84._28_4_ = uVar37;
                auVar72 = vfmsub132ps_fma(auVar84,local_5aa0,local_5b00);
                uVar37 = *(undefined4 *)((root.ptr - 0x20) + lVar34 * 4);
                auVar90._4_4_ = uVar37;
                auVar90._0_4_ = uVar37;
                auVar90._8_4_ = uVar37;
                auVar90._12_4_ = uVar37;
                auVar90._16_4_ = uVar37;
                auVar90._20_4_ = uVar37;
                auVar90._24_4_ = uVar37;
                auVar90._28_4_ = uVar37;
                uVar37 = *(undefined4 *)((root.ptr - 0x80) + lVar34 * 4);
                auVar19._4_4_ = uVar37;
                auVar19._0_4_ = uVar37;
                auVar19._8_4_ = uVar37;
                auVar19._12_4_ = uVar37;
                auVar19._16_4_ = uVar37;
                auVar19._20_4_ = uVar37;
                auVar19._24_4_ = uVar37;
                auVar19._28_4_ = uVar37;
                auVar48 = vfmsub132ps_avx512vl(local_5b20,local_5ac0,auVar19);
                uVar37 = *(undefined4 *)((root.ptr - 0x40) + lVar34 * 4);
                auVar20._4_4_ = uVar37;
                auVar20._0_4_ = uVar37;
                auVar20._8_4_ = uVar37;
                auVar20._12_4_ = uVar37;
                auVar20._16_4_ = uVar37;
                auVar20._20_4_ = uVar37;
                auVar20._24_4_ = uVar37;
                auVar20._28_4_ = uVar37;
                auVar45 = vfmsub132ps_avx512vl(local_5b00,local_5aa0,auVar20);
                auVar69 = vfmsub132ps_fma(auVar90,local_5a80,local_5ae0);
                auVar91 = ZEXT1664(auVar69);
                uVar37 = *(undefined4 *)(root.ptr + lVar34 * 4);
                auVar21._4_4_ = uVar37;
                auVar21._0_4_ = uVar37;
                auVar21._8_4_ = uVar37;
                auVar21._12_4_ = uVar37;
                auVar21._16_4_ = uVar37;
                auVar21._20_4_ = uVar37;
                auVar21._24_4_ = uVar37;
                auVar21._28_4_ = uVar37;
                auVar50 = vfmsub132ps_avx512vl(local_5ae0,local_5a80,auVar21);
                auVar46 = vpminsd_avx2(ZEXT1632(auVar81),auVar48);
                auVar47 = vpminsd_avx2(ZEXT1632(auVar72),auVar45);
                auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                auVar47 = vpminsd_avx2(ZEXT1632(auVar69),auVar50);
                auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                auVar47 = vpmaxsd_avx2(ZEXT1632(auVar81),auVar48);
                auVar48 = vpmaxsd_avx2(ZEXT1632(auVar72),auVar45);
                auVar48 = vpminsd_avx2(auVar47,auVar48);
                auVar47 = vpmaxsd_avx2(ZEXT1632(auVar69),auVar50);
                auVar48 = vpminsd_avx2(auVar48,auVar47);
                auVar27._4_4_ = uStack_59fc;
                auVar27._0_4_ = local_5a00;
                auVar27._8_4_ = uStack_59f8;
                auVar27._12_4_ = uStack_59f4;
                auVar27._16_4_ = uStack_59f0;
                auVar27._20_4_ = uStack_59ec;
                auVar27._24_4_ = uStack_59e8;
                auVar27._28_4_ = uStack_59e4;
                auVar47 = vpmaxsd_avx2(auVar46,auVar27);
                auVar48 = vpminsd_avx2(auVar48,local_59e0);
                uVar40 = vpcmpd_avx512vl(auVar47,auVar48,2);
              }
              else {
                uVar37 = *(undefined4 *)((uVar32 - 0xa0) + lVar34 * 4);
                auVar68._4_4_ = uVar37;
                auVar68._0_4_ = uVar37;
                auVar68._8_4_ = uVar37;
                auVar68._12_4_ = uVar37;
                auVar68._16_4_ = uVar37;
                auVar68._20_4_ = uVar37;
                auVar68._24_4_ = uVar37;
                auVar68._28_4_ = uVar37;
                uVar37 = *(undefined4 *)((uVar32 - 0x80) + lVar34 * 4);
                auVar67._4_4_ = uVar37;
                auVar67._0_4_ = uVar37;
                auVar67._8_4_ = uVar37;
                auVar67._12_4_ = uVar37;
                auVar67._16_4_ = uVar37;
                auVar67._20_4_ = uVar37;
                auVar67._24_4_ = uVar37;
                auVar67._28_4_ = uVar37;
                uVar37 = *(undefined4 *)((uVar32 - 0x60) + lVar34 * 4);
                auVar65._4_4_ = uVar37;
                auVar65._0_4_ = uVar37;
                auVar65._8_4_ = uVar37;
                auVar65._12_4_ = uVar37;
                auVar65._16_4_ = uVar37;
                auVar65._20_4_ = uVar37;
                auVar65._24_4_ = uVar37;
                auVar65._28_4_ = uVar37;
                uVar37 = *(undefined4 *)((uVar32 - 0x40) + lVar34 * 4);
                auVar99._4_4_ = uVar37;
                auVar99._0_4_ = uVar37;
                auVar99._8_4_ = uVar37;
                auVar99._12_4_ = uVar37;
                auVar99._16_4_ = uVar37;
                auVar99._20_4_ = uVar37;
                auVar99._24_4_ = uVar37;
                auVar99._28_4_ = uVar37;
                uVar37 = *(undefined4 *)((uVar32 - 0x20) + lVar34 * 4);
                auVar96._4_4_ = uVar37;
                auVar96._0_4_ = uVar37;
                auVar96._8_4_ = uVar37;
                auVar96._12_4_ = uVar37;
                auVar96._16_4_ = uVar37;
                auVar96._20_4_ = uVar37;
                auVar96._24_4_ = uVar37;
                auVar96._28_4_ = uVar37;
                uVar37 = *(undefined4 *)(uVar32 + lVar34 * 4);
                auVar87._4_4_ = uVar37;
                auVar87._0_4_ = uVar37;
                auVar87._8_4_ = uVar37;
                auVar87._12_4_ = uVar37;
                auVar87._16_4_ = uVar37;
                auVar87._20_4_ = uVar37;
                auVar87._24_4_ = uVar37;
                auVar87._28_4_ = uVar37;
                fVar11 = *(float *)(uVar32 + 0x20 + lVar34 * 4);
                auVar85._4_4_ = fVar11;
                auVar85._0_4_ = fVar11;
                auVar85._8_4_ = fVar11;
                auVar85._12_4_ = fVar11;
                auVar85._16_4_ = fVar11;
                auVar85._20_4_ = fVar11;
                auVar85._24_4_ = fVar11;
                auVar85._28_4_ = fVar11;
                fVar12 = *(float *)(uVar32 + 0x40 + lVar34 * 4);
                auVar82._4_4_ = fVar12;
                auVar82._0_4_ = fVar12;
                auVar82._8_4_ = fVar12;
                auVar82._12_4_ = fVar12;
                auVar82._16_4_ = fVar12;
                auVar82._20_4_ = fVar12;
                auVar82._24_4_ = fVar12;
                auVar82._28_4_ = fVar12;
                fVar13 = *(float *)(uVar32 + 0x60 + lVar34 * 4);
                auVar70._4_4_ = fVar13;
                auVar70._0_4_ = fVar13;
                auVar70._8_4_ = fVar13;
                auVar70._12_4_ = fVar13;
                auVar70._16_4_ = fVar13;
                auVar70._20_4_ = fVar13;
                auVar70._24_4_ = fVar13;
                auVar70._28_4_ = fVar13;
                auVar24._4_4_ = local_5be0._4_4_;
                auVar24._0_4_ = local_5be0._0_4_;
                auVar24._8_4_ = local_5be0._8_4_;
                auVar24._12_4_ = local_5be0._12_4_;
                auVar24._16_4_ = local_5be0._16_4_;
                auVar24._20_4_ = local_5be0._20_4_;
                auVar24._24_4_ = local_5be0._24_4_;
                auVar24._28_4_ = local_5be0._28_4_;
                auVar25._4_4_ = local_5be0._36_4_;
                auVar25._0_4_ = local_5be0._32_4_;
                auVar25._8_4_ = local_5be0._40_4_;
                auVar25._12_4_ = local_5be0._44_4_;
                auVar25._16_4_ = local_5be0._48_4_;
                auVar25._20_4_ = local_5be0._52_4_;
                auVar25._24_4_ = local_5be0._56_4_;
                auVar25._28_4_ = local_5be0._60_4_;
                auVar26._4_4_ = local_5be0._68_4_;
                auVar26._0_4_ = local_5be0._64_4_;
                auVar26._8_4_ = local_5be0._72_4_;
                auVar26._12_4_ = local_5be0._76_4_;
                auVar26._16_4_ = local_5be0._80_4_;
                auVar26._20_4_ = local_5be0._84_4_;
                auVar26._24_4_ = local_5be0._88_4_;
                auVar26._28_4_ = local_5be0._92_4_;
                auVar66._0_4_ = (float)local_5b40._0_4_ * fVar11;
                auVar66._4_4_ = (float)local_5b40._4_4_ * fVar11;
                auVar66._8_4_ = fStack_5b38 * fVar11;
                auVar66._12_4_ = fStack_5b34 * fVar11;
                auVar66._16_4_ = fStack_5b30 * fVar11;
                auVar66._20_4_ = fStack_5b2c * fVar11;
                auVar66._24_4_ = fStack_5b28 * fVar11;
                auVar93._0_4_ = (float)local_5b40._0_4_ * fVar12;
                auVar93._4_4_ = (float)local_5b40._4_4_ * fVar12;
                auVar93._8_4_ = fStack_5b38 * fVar12;
                auVar93._12_4_ = fStack_5b34 * fVar12;
                auVar93._16_4_ = fStack_5b30 * fVar12;
                auVar93._20_4_ = fStack_5b2c * fVar12;
                auVar93._28_36_ = auVar92._28_36_;
                auVar93._24_4_ = fStack_5b28 * fVar12;
                auVar22._4_4_ = (float)local_5b40._4_4_ * fVar13;
                auVar22._0_4_ = (float)local_5b40._0_4_ * fVar13;
                auVar22._8_4_ = fStack_5b38 * fVar13;
                auVar22._12_4_ = fStack_5b34 * fVar13;
                auVar22._16_4_ = fStack_5b30 * fVar13;
                auVar22._20_4_ = fStack_5b2c * fVar13;
                auVar22._24_4_ = fStack_5b28 * fVar13;
                auVar22._28_4_ = uStack_5b24;
                auVar46 = vfmadd231ps_avx512vl(auVar66._0_32_,local_5b60,auVar99);
                auVar47 = vfmadd231ps_avx512vl(auVar93._0_32_,local_5b60,auVar96);
                auVar48 = vfmadd231ps_avx512vl(auVar22,auVar87,local_5b60);
                auVar46 = vfmadd231ps_avx512vl(auVar46,local_5b80,auVar68);
                auVar47 = vfmadd231ps_avx512vl(auVar47,local_5b80,auVar67);
                auVar48 = vfmadd231ps_avx512vl(auVar48,auVar65,local_5b80);
                auVar45 = auVar100._0_32_;
                vandps_avx512vl(auVar46,auVar45);
                auVar50 = auVar101._0_32_;
                uVar40 = vcmpps_avx512vl(auVar48,auVar50,1);
                bVar31 = (bool)((byte)uVar40 & 1);
                iVar42 = auVar101._0_4_;
                auVar51._0_4_ = (uint)bVar31 * iVar42 | (uint)!bVar31 * auVar46._0_4_;
                bVar31 = (bool)((byte)(uVar40 >> 1) & 1);
                iVar58 = auVar101._4_4_;
                auVar51._4_4_ = (uint)bVar31 * iVar58 | (uint)!bVar31 * auVar46._4_4_;
                bVar31 = (bool)((byte)(uVar40 >> 2) & 1);
                iVar59 = auVar101._8_4_;
                auVar51._8_4_ = (uint)bVar31 * iVar59 | (uint)!bVar31 * auVar46._8_4_;
                bVar31 = (bool)((byte)(uVar40 >> 3) & 1);
                iVar60 = auVar101._12_4_;
                auVar51._12_4_ = (uint)bVar31 * iVar60 | (uint)!bVar31 * auVar46._12_4_;
                bVar31 = (bool)((byte)(uVar40 >> 4) & 1);
                iVar61 = auVar101._16_4_;
                auVar51._16_4_ = (uint)bVar31 * iVar61 | (uint)!bVar31 * auVar46._16_4_;
                bVar31 = (bool)((byte)(uVar40 >> 5) & 1);
                iVar62 = auVar101._20_4_;
                auVar51._20_4_ = (uint)bVar31 * iVar62 | (uint)!bVar31 * auVar46._20_4_;
                bVar31 = (bool)((byte)(uVar40 >> 6) & 1);
                iVar63 = auVar101._24_4_;
                iVar64 = auVar101._28_4_;
                auVar51._24_4_ = (uint)bVar31 * iVar63 | (uint)!bVar31 * auVar46._24_4_;
                bVar31 = SUB81(uVar40 >> 7,0);
                auVar51._28_4_ = (uint)bVar31 * iVar64 | (uint)!bVar31 * auVar46._28_4_;
                vandps_avx512vl(auVar47,auVar45);
                uVar40 = vcmpps_avx512vl(auVar51,auVar50,1);
                bVar31 = (bool)((byte)uVar40 & 1);
                auVar52._0_4_ = (uint)bVar31 * iVar42 | (uint)!bVar31 * auVar47._0_4_;
                bVar31 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar52._4_4_ = (uint)bVar31 * iVar58 | (uint)!bVar31 * auVar47._4_4_;
                bVar31 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar52._8_4_ = (uint)bVar31 * iVar59 | (uint)!bVar31 * auVar47._8_4_;
                bVar31 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar52._12_4_ = (uint)bVar31 * iVar60 | (uint)!bVar31 * auVar47._12_4_;
                bVar31 = (bool)((byte)(uVar40 >> 4) & 1);
                auVar52._16_4_ = (uint)bVar31 * iVar61 | (uint)!bVar31 * auVar47._16_4_;
                bVar31 = (bool)((byte)(uVar40 >> 5) & 1);
                auVar52._20_4_ = (uint)bVar31 * iVar62 | (uint)!bVar31 * auVar47._20_4_;
                bVar31 = (bool)((byte)(uVar40 >> 6) & 1);
                auVar52._24_4_ = (uint)bVar31 * iVar63 | (uint)!bVar31 * auVar47._24_4_;
                bVar31 = SUB81(uVar40 >> 7,0);
                auVar52._28_4_ = (uint)bVar31 * iVar64 | (uint)!bVar31 * auVar47._28_4_;
                vandps_avx512vl(auVar48,auVar45);
                uVar40 = vcmpps_avx512vl(auVar52,auVar50,1);
                bVar31 = (bool)((byte)uVar40 & 1);
                auVar53._0_4_ = (uint)bVar31 * iVar42 | (uint)!bVar31 * auVar48._0_4_;
                bVar31 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar53._4_4_ = (uint)bVar31 * iVar58 | (uint)!bVar31 * auVar48._4_4_;
                bVar31 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar53._8_4_ = (uint)bVar31 * iVar59 | (uint)!bVar31 * auVar48._8_4_;
                bVar31 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar53._12_4_ = (uint)bVar31 * iVar60 | (uint)!bVar31 * auVar48._12_4_;
                bVar31 = (bool)((byte)(uVar40 >> 4) & 1);
                auVar53._16_4_ = (uint)bVar31 * iVar61 | (uint)!bVar31 * auVar48._16_4_;
                bVar31 = (bool)((byte)(uVar40 >> 5) & 1);
                auVar53._20_4_ = (uint)bVar31 * iVar62 | (uint)!bVar31 * auVar48._20_4_;
                bVar31 = (bool)((byte)(uVar40 >> 6) & 1);
                auVar53._24_4_ = (uint)bVar31 * iVar63 | (uint)!bVar31 * auVar48._24_4_;
                bVar31 = SUB81(uVar40 >> 7,0);
                auVar53._28_4_ = (uint)bVar31 * iVar64 | (uint)!bVar31 * auVar48._28_4_;
                auVar46 = vrcp14ps_avx512vl(auVar51);
                auVar45 = auVar102._0_32_;
                auVar47 = vfnmadd213ps_avx512vl(auVar51,auVar46,auVar45);
                auVar46 = vfmadd132ps_avx512vl(auVar47,auVar46,auVar46);
                auVar91 = ZEXT3264(auVar46);
                auVar47 = vrcp14ps_avx512vl(auVar52);
                auVar48 = vfnmadd213ps_avx512vl(auVar52,auVar47,auVar45);
                auVar47 = vfmadd132ps_avx512vl(auVar48,auVar47,auVar47);
                auVar92 = ZEXT3264(auVar47);
                auVar48 = vrcp14ps_avx512vl(auVar53);
                auVar45 = vfnmadd213ps_avx512vl(auVar53,auVar48,auVar45);
                auVar48 = vfmadd132ps_avx512vl(auVar45,auVar48,auVar48);
                auVar57 = auVar104._0_32_;
                auVar45 = vxorps_avx512vl(auVar46,auVar57);
                auVar50 = vxorps_avx512vl(auVar47,auVar57);
                uVar37 = *(undefined4 *)(uVar32 + 0x80 + lVar34 * 4);
                auVar55._4_4_ = uVar37;
                auVar55._0_4_ = uVar37;
                auVar55._8_4_ = uVar37;
                auVar55._12_4_ = uVar37;
                auVar55._16_4_ = uVar37;
                auVar55._20_4_ = uVar37;
                auVar55._24_4_ = uVar37;
                auVar55._28_4_ = uVar37;
                auVar54 = vfmadd213ps_avx512vl(auVar85,auVar26,auVar55);
                uVar37 = *(undefined4 *)(uVar32 + 0xa0 + lVar34 * 4);
                auVar56._4_4_ = uVar37;
                auVar56._0_4_ = uVar37;
                auVar56._8_4_ = uVar37;
                auVar56._12_4_ = uVar37;
                auVar56._16_4_ = uVar37;
                auVar56._20_4_ = uVar37;
                auVar56._24_4_ = uVar37;
                auVar56._28_4_ = uVar37;
                auVar55 = vfmadd213ps_avx512vl(auVar82,auVar26,auVar56);
                auVar56 = vxorps_avx512vl(auVar48,auVar57);
                uVar37 = *(undefined4 *)(uVar32 + 0xc0 + lVar34 * 4);
                auVar57._4_4_ = uVar37;
                auVar57._0_4_ = uVar37;
                auVar57._8_4_ = uVar37;
                auVar57._12_4_ = uVar37;
                auVar57._16_4_ = uVar37;
                auVar57._20_4_ = uVar37;
                auVar57._24_4_ = uVar37;
                auVar57._28_4_ = uVar37;
                auVar57 = vfmadd213ps_avx512vl(auVar70,auVar26,auVar57);
                auVar81 = vfmadd231ps_fma(auVar54,auVar25,auVar99);
                auVar72 = vfmadd231ps_fma(auVar55,auVar25,auVar96);
                auVar69 = vfmadd231ps_fma(auVar57,auVar25,auVar87);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar24,auVar68);
                auVar45 = vmulps_avx512vl(ZEXT1632(auVar81),auVar45);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar24,auVar67);
                auVar50 = vmulps_avx512vl(ZEXT1632(auVar81),auVar50);
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar24,auVar65);
                auVar54 = vmulps_avx512vl(ZEXT1632(auVar81),auVar56);
                auVar74._0_4_ = auVar46._0_4_ + auVar45._0_4_;
                auVar74._4_4_ = auVar46._4_4_ + auVar45._4_4_;
                auVar74._8_4_ = auVar46._8_4_ + auVar45._8_4_;
                auVar74._12_4_ = auVar46._12_4_ + auVar45._12_4_;
                auVar74._16_4_ = auVar46._16_4_ + auVar45._16_4_;
                auVar74._20_4_ = auVar46._20_4_ + auVar45._20_4_;
                auVar74._24_4_ = auVar46._24_4_ + auVar45._24_4_;
                auVar74._28_4_ = auVar46._28_4_ + auVar45._28_4_;
                auVar83._0_4_ = auVar47._0_4_ + auVar50._0_4_;
                auVar83._4_4_ = auVar47._4_4_ + auVar50._4_4_;
                auVar83._8_4_ = auVar47._8_4_ + auVar50._8_4_;
                auVar83._12_4_ = auVar47._12_4_ + auVar50._12_4_;
                auVar83._16_4_ = auVar47._16_4_ + auVar50._16_4_;
                auVar83._20_4_ = auVar47._20_4_ + auVar50._20_4_;
                auVar83._24_4_ = auVar47._24_4_ + auVar50._24_4_;
                auVar83._28_4_ = auVar47._28_4_ + auVar50._28_4_;
                auVar86._0_4_ = auVar48._0_4_ + auVar54._0_4_;
                auVar86._4_4_ = auVar48._4_4_ + auVar54._4_4_;
                auVar86._8_4_ = auVar48._8_4_ + auVar54._8_4_;
                auVar86._12_4_ = auVar48._12_4_ + auVar54._12_4_;
                auVar86._16_4_ = auVar48._16_4_ + auVar54._16_4_;
                auVar86._20_4_ = auVar48._20_4_ + auVar54._20_4_;
                auVar86._24_4_ = auVar48._24_4_ + auVar54._24_4_;
                auVar86._28_4_ = auVar48._28_4_ + auVar54._28_4_;
                auVar46 = vpminsd_avx2(auVar45,auVar74);
                auVar47 = vpminsd_avx2(auVar50,auVar83);
                auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                auVar47 = vpminsd_avx2(auVar54,auVar86);
                auVar46 = vpmaxsd_avx2(auVar46,auVar47);
                auVar47 = vpmaxsd_avx2(auVar45,auVar74);
                auVar48 = vpmaxsd_avx2(auVar50,auVar83);
                auVar48 = vpminsd_avx2(auVar47,auVar48);
                auVar47 = vpmaxsd_avx2(auVar54,auVar86);
                auVar48 = vpminsd_avx2(auVar48,auVar47);
                auVar28._4_4_ = uStack_59fc;
                auVar28._0_4_ = local_5a00;
                auVar28._8_4_ = uStack_59f8;
                auVar28._12_4_ = uStack_59f4;
                auVar28._16_4_ = uStack_59f0;
                auVar28._20_4_ = uStack_59ec;
                auVar28._24_4_ = uStack_59e8;
                auVar28._28_4_ = uStack_59e4;
                auVar47 = vpmaxsd_avx2(auVar46,auVar28);
                auVar48 = vpminsd_avx2(auVar48,local_59e0);
                uVar40 = vcmpps_avx512vl(auVar47,auVar48,2);
              }
              if ((byte)uVar40 == 0) {
                auVar66 = ZEXT3264(auVar49);
                uVar41 = uVar39;
              }
              else {
                auVar47 = vblendmps_avx512vl(auVar103._0_32_,auVar46);
                bVar31 = (bool)((byte)uVar40 & 1);
                bVar4 = (bool)((byte)(uVar40 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar40 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar40 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar40 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar40 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar40 >> 6) & 1);
                bVar10 = SUB81(uVar40 >> 7,0);
                auVar66 = ZEXT3264(CONCAT428((uint)bVar10 * auVar47._28_4_ |
                                             (uint)!bVar10 * auVar46._28_4_,
                                             CONCAT424((uint)bVar9 * auVar47._24_4_ |
                                                       (uint)!bVar9 * auVar46._24_4_,
                                                       CONCAT420((uint)bVar8 * auVar47._20_4_ |
                                                                 (uint)!bVar8 * auVar46._20_4_,
                                                                 CONCAT416((uint)bVar7 *
                                                                           auVar47._16_4_ |
                                                                           (uint)!bVar7 *
                                                                           auVar46._16_4_,
                                                                           CONCAT412((uint)bVar6 *
                                                                                     auVar47._12_4_
                                                                                     | (uint)!bVar6
                                                                                       * auVar46.
                                                  _12_4_,CONCAT48((uint)bVar5 * auVar47._8_4_ |
                                                                  (uint)!bVar5 * auVar46._8_4_,
                                                                  CONCAT44((uint)bVar4 *
                                                                           auVar47._4_4_ |
                                                                           (uint)!bVar4 *
                                                                           auVar46._4_4_,
                                                                           (uint)bVar31 *
                                                                           auVar47._0_4_ |
                                                                           (uint)!bVar31 *
                                                                           auVar46._0_4_))))))));
                if (uVar39 != 8) {
                  *puVar33 = uVar39;
                  puVar33 = puVar33 + 1;
                  *pauVar36 = auVar49;
                  pauVar36 = pauVar36 + 1;
                }
              }
              uVar39 = uVar41;
              lVar34 = lVar34 + 1;
              auVar49 = auVar66._0_32_;
            } while (lVar34 != 0x40);
            if (uVar39 == 8) goto LAB_007c9f3b;
            uVar18 = vcmpps_avx512vl(auVar66._0_32_,local_59e0,9);
            root.ptr = uVar39;
          } while ((byte)uVar35 < (byte)POPCOUNT((int)uVar18));
          *puVar33 = uVar39;
          puVar33 = puVar33 + 1;
          *pauVar36 = auVar66._0_32_;
          pauVar36 = pauVar36 + 1;
LAB_007c9f3b:
          iVar42 = 4;
        }
        else {
          do {
            sVar2 = 0;
            for (uVar32 = uVar39; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              sVar2 = sVar2 + 1;
            }
            auVar91 = ZEXT1664(auVar91._0_16_);
            auVar92 = ZEXT1664(auVar92._0_16_);
            bVar31 = occluded1(This,bvh,root,sVar2,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_false> *)&local_5be0.field_0,context);
            bVar30 = (byte)(1 << ((uint)sVar2 & 0x1f));
            if (!bVar31) {
              bVar30 = 0;
            }
            local_5c44 = local_5c44 | bVar30;
            uVar39 = uVar39 - 1 & uVar39;
          } while (uVar39 != 0);
          iVar42 = 3;
          if (local_5c44 != 0xff) {
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar31 = (bool)(local_5c44 >> 1 & 1);
            bVar4 = (bool)(local_5c44 >> 2 & 1);
            bVar5 = (bool)(local_5c44 >> 3 & 1);
            bVar6 = (bool)(local_5c44 >> 4 & 1);
            bVar7 = (bool)(local_5c44 >> 5 & 1);
            bVar8 = (bool)(local_5c44 >> 6 & 1);
            local_59e0._4_4_ = (uint)bVar31 * auVar46._4_4_ | (uint)!bVar31 * local_59e0._4_4_;
            local_59e0._0_4_ =
                 (uint)(local_5c44 & 1) * auVar46._0_4_ |
                 (uint)!(bool)(local_5c44 & 1) * local_59e0._0_4_;
            local_59e0._8_4_ = (uint)bVar4 * auVar46._8_4_ | (uint)!bVar4 * local_59e0._8_4_;
            local_59e0._12_4_ = (uint)bVar5 * auVar46._12_4_ | (uint)!bVar5 * local_59e0._12_4_;
            local_59e0._16_4_ = (uint)bVar6 * auVar46._16_4_ | (uint)!bVar6 * local_59e0._16_4_;
            local_59e0._20_4_ = (uint)bVar7 * auVar46._20_4_ | (uint)!bVar7 * local_59e0._20_4_;
            local_59e0._24_4_ = (uint)bVar8 * auVar46._24_4_ | (uint)!bVar8 * local_59e0._24_4_;
            local_59e0._28_4_ =
                 (uint)(local_5c44 >> 7) * auVar46._28_4_ |
                 (uint)!(bool)(local_5c44 >> 7) * local_59e0._28_4_;
            iVar42 = 2;
          }
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar100 = ZEXT3264(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar101 = ZEXT3264(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar102 = ZEXT3264(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar103 = ZEXT3264(auVar46);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar104 = ZEXT3264(auVar46);
          auVar66 = ZEXT3264(auVar49);
          if (uVar35 < (uint)POPCOUNT(uVar37)) goto LAB_007c9bf2;
        }
      } while (iVar42 != 3);
LAB_007ca17a:
      local_5c44 = local_5c44 & bVar38;
      bVar31 = (bool)(local_5c44 >> 1 & 1);
      bVar4 = (bool)(local_5c44 >> 2 & 1);
      bVar5 = (bool)(local_5c44 >> 3 & 1);
      bVar6 = (bool)(local_5c44 >> 4 & 1);
      bVar7 = (bool)(local_5c44 >> 5 & 1);
      bVar8 = (bool)(local_5c44 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(local_5c44 & 1) * -0x800000 |
           (uint)!(bool)(local_5c44 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar31 * -0x800000 | (uint)!bVar31 * *(int *)(ray + 0x104);
      *(uint *)(ray + 0x108) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(local_5c44 >> 7) * -0x800000 |
           (uint)!(bool)(local_5c44 >> 7) * *(int *)(ray + 0x11c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }